

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
vera::Model::setBufferShader(Model *this,string *_name,string *_fragStr,string *_vertStr)

{
  bool bVar1;
  mapped_type *ppSVar2;
  pointer ppVar3;
  Shader *pSVar4;
  _Self local_38;
  _Self local_30;
  iterator it;
  string *_vertStr_local;
  string *_fragStr_local;
  string *_name_local;
  Model *this_local;
  
  it._M_node = (_Base_ptr)_vertStr;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
       ::find(&this->gBuffersShaders,_name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
       ::end(&this->gBuffersShaders);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    pSVar4 = (Shader *)operator_new(0x100);
    Shader::Shader(pSVar4);
    ppSVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
              ::operator[](&this->gBuffersShaders,_name);
    *ppSVar2 = pSVar4;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
         ::find(&this->gBuffersShaders,_name);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>
             ::operator->(&local_30);
    if (ppVar3->second == (Shader *)0x0) {
      pSVar4 = (Shader *)operator_new(0x100);
      Shader::Shader(pSVar4);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>
               ::operator->(&local_30);
      ppVar3->second = pSVar4;
    }
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>
           ::operator->(&local_30);
  (*(ppVar3->second->super_HaveDefines)._vptr_HaveDefines[0xc])(ppVar3->second,&this->mainShader);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>
           ::operator->(&local_30);
  Shader::setSource(ppVar3->second,_fragStr,(string *)it._M_node);
  return;
}

Assistant:

void Model::setBufferShader(const std::string _name, const std::string& _fragStr, const std::string& _vertStr) {
    ShaderMap::iterator it = gBuffersShaders.find(_name);

    if (it == gBuffersShaders.end()) {
        gBuffersShaders[_name] = new Shader();
        it = gBuffersShaders.find(_name);
    }
    else
        if (it->second == nullptr)
            it->second = new Shader();

    it->second->mergeDefines(&mainShader);
    it->second->setSource( _fragStr, _vertStr);
}